

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void Vertical_Sweep_Span(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  
  lVar12 = (long)worker->precision;
  uVar3 = (lVar12 + x1) - 1U & -lVar12;
  uVar10 = -lVar12 & x2;
  if ((left->flags & 7) != 2) {
    uVar8 = uVar3;
    if (uVar3 == x1) {
      uVar8 = uVar10;
    }
    if (uVar10 == x2) {
      uVar8 = uVar10;
    }
    if (x2 - (lVar12 + x1) <= (long)worker->precision_jitter) {
      uVar10 = uVar8;
    }
  }
  bVar7 = (byte)worker->precision_bits;
  lVar12 = (long)uVar3 >> (bVar7 & 0x3f);
  uVar10 = (long)uVar10 >> (bVar7 & 0x3f);
  if (-1 < (long)uVar10) {
    uVar1 = worker->bWidth;
    if (lVar12 < (long)(ulong)uVar1) {
      uVar9 = 0;
      if (0 < lVar12) {
        uVar9 = (uint)lVar12;
      }
      uVar2 = uVar1 - 1;
      if (uVar10 < uVar1) {
        uVar2 = (uint)uVar10;
      }
      bVar11 = 0xff >> ((byte)uVar9 & 7);
      uVar9 = uVar9 >> 3;
      bVar7 = -0x80 >> ((byte)uVar2 & 7);
      iVar5 = (int)(short)(uVar2 >> 3);
      iVar6 = iVar5 - uVar9;
      if (iVar6 == 0 || iVar5 < (int)uVar9) {
        pbVar4 = worker->bLine + uVar9;
        bVar7 = bVar7 & bVar11;
      }
      else {
        pbVar4 = worker->bLine + uVar9;
        *pbVar4 = *pbVar4 | bVar11;
        for (; pbVar4 = pbVar4 + 1, 1 < iVar6; iVar6 = iVar6 + -1) {
          *pbVar4 = 0xff;
        }
      }
      *pbVar4 = *pbVar4 | bVar7;
    }
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Span( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long  e1, e2;

    Int  dropOutControl = left->flags & 7;

    FT_UNUSED( y );
    FT_UNUSED( left );
    FT_UNUSED( right );


    /* in high-precision mode, we need 12 digits after the comma to */
    /* represent multiples of 1/(1<<12) = 1/4096                    */
    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    e1 = CEILING( x1 );
    e2 = FLOOR( x2 );

    /* take care of the special case where both the left */
    /* and right contour lie exactly on pixel centers    */
    if ( dropOutControl != 2                             &&
         x2 - x1 - ras.precision <= ras.precision_jitter &&
         e1 != x1 && e2 != x2                            )
      e2 = e1;

    e1 = TRUNC( e1 );
    e2 = TRUNC( e2 );

    if ( e2 >= 0 && e1 < ras.bWidth )
    {
      Byte*  target;

      Int   c1, c2;
      Byte  f1, f2;


      if ( e1 < 0 )
        e1 = 0;
      if ( e2 >= ras.bWidth )
        e2 = ras.bWidth - 1;

      FT_TRACE7(( " -> x=[%ld;%ld]", e1, e2 ));

      c1 = (Short)( e1 >> 3 );
      c2 = (Short)( e2 >> 3 );

      f1 = (Byte)  ( 0xFF >> ( e1 & 7 ) );
      f2 = (Byte) ~( 0x7F >> ( e2 & 7 ) );

      target = ras.bLine + c1;
      c2 -= c1;

      if ( c2 > 0 )
      {
        target[0] |= f1;

        /* memset() is slower than the following code on many platforms. */
        /* This is due to the fact that, in the vast majority of cases,  */
        /* the span length in bytes is relatively small.                 */
        while ( --c2 > 0 )
          *( ++target ) = 0xFF;

        target[1] |= f2;
      }
      else
        *target |= ( f1 & f2 );
    }

    FT_TRACE7(( "\n" ));
  }